

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int read_symlink_stored(archive_read *a,archive_entry *entry,archive_string_conv *sconv)

{
  void *pvVar1;
  wchar_t wVar2;
  char *pcVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  
  pvVar1 = a->format->data;
  iVar6 = 0;
  pcVar3 = (char *)__archive_read_ahead(a,*(size_t *)((long)pvVar1 + 0x20),(ssize_t *)0x0);
  iVar5 = -0x1e;
  if (pcVar3 != (char *)0x0) {
    wVar2 = _archive_entry_copy_symlink_l(entry,pcVar3,*(size_t *)((long)pvVar1 + 0x20),sconv);
    if (wVar2 != L'\0') {
      piVar4 = __errno_location();
      if (*piVar4 == 0xc) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory for link");
        return -0x1e;
      }
      pcVar3 = archive_string_conversion_charset_name(sconv);
      archive_set_error(&a->archive,0x54,"link cannot be converted from %s to current locale.",
                        pcVar3);
      iVar6 = -0x14;
    }
    __archive_read_consume(a,*(int64_t *)((long)pvVar1 + 0x20));
    iVar5 = iVar6;
  }
  return iVar5;
}

Assistant:

static int
read_symlink_stored(struct archive_read *a, struct archive_entry *entry,
                    struct archive_string_conv *sconv)
{
  const void *h;
  const char *p;
  struct rar *rar;
  int ret = (ARCHIVE_OK);

  rar = (struct rar *)(a->format->data);
  if ((h = rar_read_ahead(a, (size_t)rar->packed_size, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;

  if (archive_entry_copy_symlink_l(entry,
      p, (size_t)rar->packed_size, sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for link");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "link cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(sconv));
    ret = (ARCHIVE_WARN);
  }
  __archive_read_consume(a, rar->packed_size);
  return ret;
}